

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.h
# Opt level: O2

Config * jaegertracing::Config::parse(Config *__return_storage_ptr__,Node *configYAML)

{
  bool bVar1;
  char (*in_R8) [1];
  allocator local_276;
  allocator local_275;
  allocator local_274;
  allocator local_273;
  allocator local_272;
  allocator local_271;
  Node baggageRestrictionsNode;
  Node headersNode;
  Node reporterNode;
  duration local_210;
  Node samplerNode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> serviceName;
  string local_1c8;
  RestrictionsConfig baggageRestrictions;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> local_178;
  duration local_158;
  Config reporter;
  Config sampler;
  HeadersConfig headers;
  
  bVar1 = YAML::Node::IsDefined(configYAML);
  if (bVar1) {
    bVar1 = YAML::Node::IsMap(configYAML);
    if (bVar1) {
      utils::yaml::findOrDefault<std::__cxx11::string,char[13],char[1]>
                (&serviceName,(yaml *)configYAML,(Node *)"service_name",(char (*) [13])0x113062,
                 in_R8);
      headers._jaegerDebugHeader._M_dataplus._M_p._0_1_ = 0;
      bVar1 = utils::yaml::findOrDefault<bool,char[9],bool>
                        (configYAML,(char (*) [9])"disabled",(bool *)&headers);
      YAML::Node::operator[]<char[8]>(&samplerNode,configYAML,(char (*) [8])"sampler");
      samplers::Config::parse(&sampler,&samplerNode);
      YAML::Node::operator[]<char[9]>(&reporterNode,configYAML,(char (*) [9])"reporter");
      reporters::Config::parse(&reporter,&reporterNode);
      YAML::Node::operator[]<char[8]>(&headersNode,configYAML,(char (*) [8])"headers");
      propagation::HeadersConfig::parse(&headers,&headersNode);
      YAML::Node::operator[]<char[21]>
                (&baggageRestrictionsNode,configYAML,(char (*) [21])"baggage_restrictions");
      baggage::RestrictionsConfig::parse(&baggageRestrictions,&baggageRestrictionsNode);
      local_1c8._M_dataplus._M_p = (pointer)0x0;
      local_1c8._M_string_length = 0;
      local_1c8.field_2._M_allocated_capacity = 0;
      Config(__return_storage_ptr__,bVar1,&sampler,&reporter,&headers,&baggageRestrictions,
             &serviceName,
             (vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)&local_1c8);
      std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
                ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)&local_1c8);
      std::__cxx11::string::~string((string *)&baggageRestrictions._hostPort);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&baggageRestrictionsNode.m_pMemory.
                  super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      propagation::HeadersConfig::~HeadersConfig(&headers);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&headersNode.m_pMemory.
                  super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      reporters::Config::~Config(&reporter);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&reporterNode.m_pMemory.
                  super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      samplers::Config::~Config(&sampler);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&samplerNode.m_pMemory.
                  super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      goto LAB_0010dc39;
    }
  }
  std::__cxx11::string::string((string *)&serviceName,"remote",&local_271);
  std::__cxx11::string::string((string *)&samplerNode,"http://127.0.0.1:5778/sampling",&local_272);
  local_158.__r = 60000000000;
  samplers::Config::Config(&sampler,&serviceName,0.001,(string *)&samplerNode,2000,&local_158);
  local_210.__r = 10000000000;
  std::__cxx11::string::string((string *)&reporterNode,"127.0.0.1:6831",&local_273);
  std::__cxx11::string::string((string *)&headersNode,"",&local_274);
  reporters::Config::Config
            (&reporter,100,&local_210,false,(string *)&reporterNode,(string *)&headersNode);
  propagation::HeadersConfig::HeadersConfig(&headers);
  std::__cxx11::string::string((string *)&baggageRestrictionsNode,"",&local_275);
  baggageRestrictions._denyBaggageOnInitializationFailure = false;
  std::__cxx11::string::string
            ((string *)&baggageRestrictions._hostPort,(string *)&baggageRestrictionsNode);
  baggageRestrictions._refreshInterval.__r = 0;
  std::__cxx11::string::string((string *)&local_1c8,"",&local_276);
  local_178.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Config(__return_storage_ptr__,false,&sampler,&reporter,&headers,&baggageRestrictions,&local_1c8,
         &local_178);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_178);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&baggageRestrictions._hostPort);
  std::__cxx11::string::~string((string *)&baggageRestrictionsNode);
  propagation::HeadersConfig::~HeadersConfig(&headers);
  reporters::Config::~Config(&reporter);
  std::__cxx11::string::~string((string *)&headersNode);
  std::__cxx11::string::~string((string *)&reporterNode);
  samplers::Config::~Config(&sampler);
  std::__cxx11::string::~string((string *)&samplerNode);
LAB_0010dc39:
  std::__cxx11::string::~string((string *)&serviceName);
  return __return_storage_ptr__;
}

Assistant:

static Config parse(const YAML::Node& configYAML)
    {
        if (!configYAML.IsDefined() || !configYAML.IsMap()) {
            return Config();
        }

        const auto serviceName =
            utils::yaml::findOrDefault<std::string>(configYAML, "service_name", "");

        const auto disabled =
            utils::yaml::findOrDefault<bool>(configYAML, "disabled", false);
        const auto samplerNode = configYAML["sampler"];
        const auto sampler = samplers::Config::parse(samplerNode);
        const auto reporterNode = configYAML["reporter"];
        const auto reporter = reporters::Config::parse(reporterNode);
        const auto headersNode = configYAML["headers"];
        const auto headers = propagation::HeadersConfig::parse(headersNode);
        const auto baggageRestrictionsNode = configYAML["baggage_restrictions"];
        const auto baggageRestrictions =
            baggage::RestrictionsConfig::parse(baggageRestrictionsNode);
        return Config(
            disabled, sampler, reporter, headers, baggageRestrictions, serviceName);
    }